

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::SequenceNode::do_render
          (SequenceNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  pointer psVar1;
  shared_ptr<minja::TemplateNode> *child;
  pointer psVar2;
  
  psVar1 = (this->children).
           super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->children).
                super__Vector_base<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    TemplateNode::render
              ((psVar2->super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               out,context);
  }
  return;
}

Assistant:

void do_render(std::ostringstream & out, const std::shared_ptr<Context> & context) const override {
        for (const auto& child : children) child->render(out, context);
    }